

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.hpp
# Opt level: O0

ostream_base * __thiscall
pstore::exchange::export_ns::ostream_base::write<_1l>(ostream_base *this,span<const_char,__1L> s)

{
  pointer peVar1;
  bool bVar2;
  index_type value;
  unsigned_long *puVar3;
  long value_00;
  pointer peVar4;
  char *pcVar5;
  span_iterator<pstore::gsl::span<const_char,__1L>,_false> local_78;
  span_iterator<pstore::gsl::span<const_char,__1L>,_false> local_68;
  undefined1 local_58 [8];
  span<const_char,__1L> ss;
  unsigned_long count;
  size_t available;
  unsigned_long remaining;
  index_type index;
  ostream_base *this_local;
  span<const_char,__1L> s_local;
  
  s_local.storage_.super_extent_type<_1L>.size_ = (index_type)s.storage_.data_;
  this_local = (ostream_base *)s.storage_.super_extent_type<_1L>.size_;
  index = (index_type)this;
  bVar2 = gsl::span<const_char,_-1L>::empty((span<const_char,__1L> *)&this_local);
  if (!bVar2) {
    remaining = 0;
    value = gsl::span<const_char,_-1L>::size((span<const_char,__1L> *)&this_local);
    for (available = unsigned_cast<long,unsigned_long,void>(value); available != 0;
        available = available - (long)ss.storage_.data_) {
      count = available_space(this);
      if (count == 0) {
        count = flush(this);
      }
      if (count == 0) {
        assert_failed("available > 0U",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/exchange/export_ostream.hpp"
                      ,0x9c);
      }
      puVar3 = std::min<unsigned_long>(&available,&count);
      peVar1 = (pointer)*puVar3;
      ss.storage_.data_ = peVar1;
      value_00 = std::numeric_limits<long>::max();
      peVar4 = (pointer)unsigned_cast<long,unsigned_long,void>(value_00);
      if (peVar4 < peVar1) {
        assert_failed("count <= unsigned_cast (std::numeric_limits<span_index_type>::max ())",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/exchange/export_ostream.hpp"
                      ,0xa2);
      }
      _local_58 = (storage_type<pstore::gsl::details::extent_type<_1L>_>)
                  gsl::span<const_char,_-1L>::subspan
                            ((span<const_char,__1L> *)&this_local,remaining,
                             (index_type)ss.storage_.data_);
      gsl::span<const_char,_-1L>::begin((span<const_char,__1L> *)&local_68);
      gsl::span<const_char,_-1L>::end((span<const_char,__1L> *)&local_78);
      pcVar5 = std::
               copy<pstore::gsl::details::span_iterator<pstore::gsl::span<char_const,_1l>,false>,char*>
                         (&local_68,&local_78,this->ptr_);
      this->ptr_ = pcVar5;
      if (this->end_ < this->ptr_) {
        assert_failed("ptr_ <= end_",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/exchange/export_ostream.hpp"
                      ,0xa5);
      }
      remaining = (unsigned_long)(ss.storage_.data_ + remaining);
    }
  }
  return this;
}

Assistant:

ostream_base & ostream_base::write (gsl::span<char const, Extent> const s) {
                if (s.empty ()) {
                    return *this;
                }
                auto index = typename gsl::span<char const, Extent>::index_type{0};
                auto remaining = unsigned_cast (s.size ());
                while (remaining > 0U) {
                    // Flush the buffer if it is full.
                    auto available = this->available_space ();
                    if (available == 0U) {
                        available = this->flush ();
                    }
                    PSTORE_ASSERT (available > 0U);

                    // Copy as many characters as we can from the input span to the buffer.
                    auto const count = std::min (remaining, available);
                    using span_index_type = gsl::span<char const>::index_type;
                    PSTORE_ASSERT (count <=
                                   unsigned_cast (std::numeric_limits<span_index_type>::max ()));
                    auto ss = s.subspan (index, static_cast<span_index_type> (count));
                    ptr_ = std::copy (ss.begin (), ss.end (), ptr_);
                    PSTORE_ASSERT (ptr_ <= end_);

                    // Adjust our view of the characters remaining to be copied.
                    remaining -= count;
                    index += count;
                }
                return *this;
            }